

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O0

nbt_status dump_byte_array_binary(nbt_byte_array ba,buffer *b)

{
  int iVar1;
  int32_t local_2c;
  buffer *pbStack_28;
  int32_t dumped_length;
  buffer *b_local;
  nbt_byte_array ba_local;
  
  b_local = (buffer *)ba.data;
  local_2c = ba.length;
  pbStack_28 = b;
  ba_local.data._0_4_ = local_2c;
  be2ne(&local_2c,4);
  iVar1 = buffer_append(pbStack_28,&local_2c,4);
  if (iVar1 == 0) {
    if (((int32_t)ba_local.data != 0) && (b_local == (buffer *)0x0)) {
      __assert_fail("ba.data",
                    "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_parsing.c"
                    ,0x280,
                    "nbt_status dump_byte_array_binary(const struct nbt_byte_array, struct buffer *)"
                   );
    }
    iVar1 = buffer_append(pbStack_28,b_local,(long)(int32_t)ba_local.data);
    if (iVar1 == 0) {
      ba_local._12_4_ = 0;
    }
    else {
      ba_local._12_4_ = 0xfffffffe;
    }
  }
  else {
    ba_local._12_4_ = 0xfffffffe;
  }
  return ba_local._12_4_;
}

Assistant:

static nbt_status dump_byte_array_binary(const struct nbt_byte_array ba, struct buffer* b)
{
    int32_t dumped_length = ba.length;

    ne2be(&dumped_length, sizeof dumped_length);

    CHECKED_APPEND(b, &dumped_length, sizeof dumped_length);

    if(ba.length) assert(ba.data);

    CHECKED_APPEND(b, ba.data, ba.length);

    return NBT_OK;
}